

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

string * leveldb::NumberToString_abi_cxx11_(uint64_t num)

{
  string *in_RDI;
  string *unaff_retaddr;
  string *r;
  string *num_00;
  
  num_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  AppendNumberTo(unaff_retaddr,(uint64_t)num_00);
  return in_RDI;
}

Assistant:

std::string NumberToString(uint64_t num) {
  std::string r;
  AppendNumberTo(&r, num);
  return r;
}